

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool leveldb::Version::Get(leveldb::ReadOptions_const&,leveldb::LookupKey_const&,std::__cxx11::
     string*,leveldb::Version::GetStats*)::State::Match(void*,int,leveldb::FileMetaData__
               (void *arg,int level,FileMetaData *f)

{
  bool bVar1;
  size_t in_RDX;
  undefined4 in_ESI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  TableCache *unaff_retaddr;
  State *state;
  undefined4 in_stack_00000038;
  Slice *msg2;
  code *msg;
  Slice *in_stack_ffffffffffffff98;
  bool local_29;
  Slice *in_stack_ffffffffffffffe0;
  uint64_t in_stack_ffffffffffffffe8;
  uint64_t in_stack_fffffffffffffff0;
  ReadOptions *options;
  
  options = *(ReadOptions **)(in_FS_OFFSET + 0x28);
  if ((*(long *)in_RDI[2].size_ == 0) && (in_RDI[4].size_ != 0)) {
    *(size_t *)in_RDI[2].size_ = in_RDI[4].size_;
    *(undefined4 *)(in_RDI[2].size_ + 8) = *(undefined4 *)&in_RDI[5].data_;
  }
  in_RDI[4].size_ = in_RDX;
  *(undefined4 *)&in_RDI[5].data_ = in_ESI;
  msg = SaveValue;
  msg2 = in_RDI;
  TableCache::Get(unaff_retaddr,options,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                  in_stack_ffffffffffffffe0,f,
                  (_func_void_void_ptr_Slice_ptr_Slice_ptr *)CONCAT44(level,in_stack_00000038));
  Status::operator=((Status *)in_stack_ffffffffffffff98,(Status *)msg);
  Status::~Status((Status *)msg2);
  bVar1 = Status::ok((Status *)msg2);
  if (bVar1) {
    switch(*(undefined4 *)&in_RDI->data_) {
    case 0:
      local_29 = true;
      break;
    case 1:
      *(undefined1 *)&in_RDI[6].size_ = 1;
      local_29 = false;
      break;
    case 2:
      local_29 = false;
      break;
    case 3:
      Slice::Slice(in_stack_ffffffffffffff98,(char *)msg);
      Status::Corruption((Slice *)msg,msg2);
      Status::operator=((Status *)in_stack_ffffffffffffff98,(Status *)msg);
      Status::~Status((Status *)msg2);
      *(undefined1 *)&in_RDI[6].size_ = 1;
      local_29 = false;
      break;
    default:
      local_29 = false;
    }
  }
  else {
    *(undefined1 *)&in_RDI[6].size_ = 1;
    local_29 = false;
  }
  if (*(ReadOptions **)(in_FS_OFFSET + 0x28) != options) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);

      if (state->stats->seek_file == nullptr &&
          state->last_file_read != nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        state->stats->seek_file = state->last_file_read;
        state->stats->seek_file_level = state->last_file_read_level;
      }

      state->last_file_read = f;
      state->last_file_read_level = level;

      state->s = state->vset->table_cache_->Get(*state->options, f->number,
                                                f->file_size, state->ikey,
                                                &state->saver, SaveValue);
      if (!state->s.ok()) {
        state->found = true;
        return false;
      }
      switch (state->saver.state) {
        case kNotFound:
          return true;  // Keep searching in other files
        case kFound:
          state->found = true;
          return false;
        case kDeleted:
          return false;
        case kCorrupt:
          state->s =
              Status::Corruption("corrupted key for ", state->saver.user_key);
          state->found = true;
          return false;
      }

      // Not reached. Added to avoid false compilation warnings of
      // "control reaches end of non-void function".
      return false;
    }